

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::nativeHasPendingDatagrams(QNativeSocketEnginePrivate *this)

{
  ssize_t sVar1;
  int *piVar2;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  bool result;
  ssize_t readBytes;
  char c;
  bool local_32;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0xaa;
  do {
    sVar1 = recv((int)*(undefined8 *)(in_RDI + 0xd8),&local_9,1,2);
    bVar3 = false;
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  local_32 = true;
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    local_32 = *piVar2 == 0x5a;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_32;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::nativeHasPendingDatagrams() const
{
    // Peek 1 bytes into the next message.
    ssize_t readBytes;
    char c;
    QT_EINTR_LOOP(readBytes, ::recv(socketDescriptor, &c, 1, MSG_PEEK));

    // If there's no error, or if our buffer was too small, there must be a
    // pending datagram.
    bool result = (readBytes != -1) || errno == EMSGSIZE;

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeHasPendingDatagrams() == %s",
           result ? "true" : "false");
#endif
    return result;
}